

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

void compute_coherence_metrics<dense_parameters>(lda *l,dense_parameters *weights)

{
  pointer *ppfVar1;
  weight *pwVar2;
  iterator __position;
  pointer pfVar3;
  iterator __position_00;
  uint32_t uVar4;
  unsigned_long uVar5;
  long lVar6;
  pointer pvVar7;
  uint64_t uVar8;
  pointer pwVar9;
  pointer pvVar10;
  __normal_iterator<word_doc_frequency_*,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  _Var11;
  _Rb_tree_node_base *p_Var12;
  mapped_type *pmVar13;
  weight *pwVar14;
  ulong uVar15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  feature_pair *pairs;
  ulong uVar18;
  ulong uVar19;
  pointer puVar20;
  pointer pfVar21;
  pointer pvVar22;
  pointer pwVar23;
  pointer puVar24;
  pointer pvVar25;
  pointer puVar26;
  long lVar27;
  vector<feature_pair,_std::allocator<feature_pair>_> *this;
  pointer puVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  _Base_ptr p_Var32;
  _Base_ptr p_Var33;
  pointer puVar34;
  pointer puVar35;
  lda *plVar36;
  float fVar37;
  float fVar38;
  undefined4 uVar39;
  float fVar40;
  initializer_list<word_doc_frequency> __l;
  vector<unsigned_long,_std::allocator<unsigned_long>_> top_features_idx;
  anon_class_1_0_00000001 cmp;
  map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  coWordsDFSet;
  vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> vec;
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  topics_word_pairs;
  ulong local_f0;
  pair<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>
  local_e8;
  allocator_type local_b9;
  lda *local_b8;
  pointer local_b0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  local_a8;
  long local_78;
  vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> local_70;
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  local_58;
  long local_38;
  
  uVar18 = 1L << ((byte)l->all->num_bits & 0x3f);
  local_58.
  super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ::resize(&local_58,l->topics);
  local_b8 = l;
  if (l->topics != 0) {
    uVar31 = 10;
    if (uVar18 < 10) {
      uVar31 = uVar18;
    }
    local_38 = uVar31 + (uVar31 == 0);
    lVar30 = 0;
    local_f0 = 0;
    do {
      local_e8.first = 0;
      local_e8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
      ::priority_queue((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                        *)&local_a8,(anon_class_1_0_00000001 *)&local_b0,
                       (vector<feature,_std::allocator<feature>_> *)&local_e8);
      if ((void *)local_e8.first != (void *)0x0) {
        operator_delete((void *)local_e8.first);
      }
      uVar4 = weights->_stride_shift;
      pwVar2 = weights->_begin;
      lVar27 = 0;
      lVar29 = local_38;
      local_78 = lVar30;
      do {
        local_e8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)(lVar27 >> 2);
        local_e8.first =
             CONCAT44(local_e8.first._4_4_,*(undefined4 *)((long)pwVar2 + lVar27 + lVar30));
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
        ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                *)&local_a8,(value_type *)&local_e8);
        lVar6 = local_78;
        lVar27 = lVar27 + (1L << ((byte)uVar4 & 0x3f)) * 4;
        lVar29 = lVar29 + -1;
      } while (lVar29 != 0);
      pwVar2 = weights->_begin;
      uVar8 = weights->_weight_mask;
      if (pwVar2 != pwVar2 + uVar8 + 1) {
        uVar4 = weights->_stride_shift;
        lVar30 = 0;
        pwVar14 = pwVar2;
        do {
          fVar38 = *(float *)((long)pwVar2 + lVar30 + lVar6);
          if (*(float *)local_a8._M_impl._0_8_ <= fVar38 &&
              fVar38 != *(float *)local_a8._M_impl._0_8_) {
            std::
            priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
            ::pop((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                   *)&local_a8);
            local_e8.second.
            super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)(lVar30 >> 2);
            local_e8.first =
                 CONCAT44(local_e8.first._4_4_,*(undefined4 *)((long)pwVar2 + lVar30 + lVar6));
            std::
            priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
            ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
                    *)&local_a8,(value_type *)&local_e8);
            pwVar14 = weights->_begin;
            uVar8 = weights->_weight_mask;
          }
          lVar30 = lVar30 + (1L << ((byte)uVar4 & 0x3f)) * 4;
        } while ((weight *)((long)pwVar2 + lVar30) != pwVar14 + uVar8 + 1);
      }
      local_e8.first = 0;
      local_e8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.second.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,
                 CONCAT44(local_a8._M_impl.super__Rb_tree_header._M_header._4_4_,
                          local_a8._M_impl.super__Rb_tree_header._M_header._M_color) -
                 local_a8._M_impl._0_8_ >> 4);
      for (uVar18 = (ulong)(CONCAT44(local_a8._M_impl.super__Rb_tree_header._M_header._4_4_,
                                     local_a8._M_impl.super__Rb_tree_header._M_header._M_color) -
                           local_a8._M_impl._0_8_) >> 4 & 0xffffffff; 0 < (int)uVar18;
          uVar18 = uVar18 - 1) {
        *(undefined8 *)(local_e8.first + uVar18 * 8 + -8) =
             *(undefined8 *)(local_a8._M_impl._0_8_ + 8);
        std::
        priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1108:16)>
        ::pop((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1108:16)>
               *)&local_a8);
      }
      pwVar23 = (pointer)local_e8.first;
      if (local_e8.second.
          super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)local_e8.first) {
        this = local_58.
               super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_f0;
        pwVar9 = local_e8.second.
                 super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar18 = 0;
        do {
          uVar19 = uVar18 + 1;
          uVar15 = (long)pwVar9 - (long)pwVar23 >> 3;
          uVar31 = uVar19;
          if (uVar19 < uVar15) {
            do {
              local_70.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)(&pwVar23->idx)[uVar18];
              local_70.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)(&pwVar23->idx)[uVar31];
              pwVar23 = local_70.
                        super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pwVar9 = local_70.
                       super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              __position._M_current =
                   (this->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<feature_pair,_std::allocator<feature_pair>_>::
                _M_realloc_insert<feature_pair>(this,__position,(feature_pair *)&local_70);
              }
              else {
                local_70.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                ._M_impl.super__Vector_impl_data._M_start._4_4_ =
                     (undefined4)
                     ((ulong)local_70.
                             super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 0x20);
                local_70.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
                     (undefined4)
                     ((ulong)local_70.
                             super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                             ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
                *(undefined4 *)&(__position._M_current)->f1 =
                     local_70.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_;
                *(undefined4 *)((long)&(__position._M_current)->f1 + 4) =
                     local_70.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_;
                *(undefined4 *)&(__position._M_current)->f2 =
                     local_70.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_finish._0_4_;
                *(undefined4 *)((long)&(__position._M_current)->f2 + 4) =
                     local_70.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_finish._4_4_;
                ppfVar1 = &(this->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>).
                           _M_impl.super__Vector_impl_data._M_finish;
                *ppfVar1 = *ppfVar1 + 1;
                local_70.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                ._M_impl.super__Vector_impl_data._M_start = pwVar23;
                local_70.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                ._M_impl.super__Vector_impl_data._M_finish = pwVar9;
              }
              uVar31 = uVar31 + 1;
              uVar15 = (long)((long)local_e8.second.
                                    super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                    ._M_impl.super__Vector_impl_data._M_start - local_e8.first) >> 3
              ;
              pwVar9 = local_e8.second.
                       super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              pwVar23 = (pointer)local_e8.first;
            } while (uVar31 < uVar15);
          }
          uVar18 = uVar19;
        } while (uVar19 < uVar15);
      }
      if (pwVar23 != (pointer)0x0) {
        operator_delete(pwVar23);
      }
      lVar30 = local_78;
      if ((float *)local_a8._M_impl._0_8_ != (float *)0x0) {
        operator_delete((void *)local_a8._M_impl._0_8_);
      }
      local_f0 = local_f0 + 1;
      lVar30 = lVar30 + 4;
    } while (local_f0 < local_b8->topics);
  }
  pvVar7 = local_58.
           super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._M_impl.super__Rb_tree_header._M_header;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_58.
      super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar10 = local_58.
              super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pfVar3 = (pvVar10->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pfVar21 = (pvVar10->super__Vector_base<feature_pair,_std::allocator<feature_pair>_>).
                     _M_impl.super__Vector_impl_data._M_start; pfVar21 != pfVar3;
          pfVar21 = pfVar21 + 1) {
        pwVar23 = (pointer)pfVar21->f1;
        local_b0 = (pointer)pfVar21->f2;
        if (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0019e599:
          local_e8.second.
          super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((ulong)local_e8.second.
                                super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
          __l._M_len = 1;
          __l._M_array = (iterator)&local_e8;
          local_e8.first = (unsigned_long)local_b0;
          std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::vector
                    (&local_70,__l,&local_b9);
          local_e8.first = (unsigned_long)pwVar23;
          std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::vector
                    (&local_e8.second,&local_70);
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>>
          ::
          _M_emplace_unique<std::pair<unsigned_long,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>>>
                      *)&local_a8,&local_e8);
          if (local_e8.second.
              super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e8.second.
                            super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_70.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_70.
                            super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          p_Var16 = local_a8._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var33 = &local_a8._M_impl.super__Rb_tree_header._M_header;
          do {
            p_Var32 = p_Var33;
            p_Var17 = p_Var16;
            pwVar9 = *(pointer *)(p_Var17 + 1);
            p_Var33 = p_Var17;
            if (pwVar9 < pwVar23) {
              p_Var33 = p_Var32;
            }
            p_Var16 = (&p_Var17->_M_left)[pwVar9 < pwVar23];
          } while ((&p_Var17->_M_left)[pwVar9 < pwVar23] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var33 == &local_a8._M_impl.super__Rb_tree_header)
          goto LAB_0019e599;
          if (pwVar9 < pwVar23) {
            p_Var17 = p_Var32;
          }
          if (pwVar23 < *(pointer *)(p_Var17 + 1)) goto LAB_0019e599;
          _Var11 = std::
                   __find_if<__gnu_cxx::__normal_iterator<word_doc_frequency*,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,__gnu_cxx::__ops::_Iter_pred<compute_coherence_metrics<dense_parameters>(lda&,dense_parameters&)::_lambda(word_doc_frequency_const&)_1_>>
                             (p_Var33[1]._M_parent,p_Var33[1]._M_left,&local_b0);
          pwVar23 = local_e8.second.
                    super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          __position_00._M_current = (word_doc_frequency *)p_Var33[1]._M_left;
          if (_Var11._M_current != __position_00._M_current) {
            local_e8.first = (unsigned_long)local_b0;
            uVar5 = local_e8.first;
            local_e8.second.
            super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_e8.second.
                                  super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
            pwVar9 = local_e8.second.
                     super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((_Base_ptr)__position_00._M_current == p_Var33[1]._M_right) {
              std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>::
              _M_realloc_insert<word_doc_frequency>
                        ((vector<word_doc_frequency,_std::allocator<word_doc_frequency>_> *)
                         &p_Var33[1]._M_parent,__position_00,(word_doc_frequency *)&local_e8);
            }
            else {
              local_e8.first._0_4_ = SUB84(local_b0,0);
              local_e8.first._4_4_ = (undefined4)((ulong)local_b0 >> 0x20);
              local_e8.second.
              super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ = SUB84(pwVar23,4);
              *(undefined4 *)&(__position_00._M_current)->idx = (undefined4)local_e8.first;
              *(undefined4 *)((long)&(__position_00._M_current)->idx + 4) = local_e8.first._4_4_;
              (__position_00._M_current)->count = 0;
              *(undefined4 *)&(__position_00._M_current)->field_0xc =
                   local_e8.second.
                   super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
                   _M_impl.super__Vector_impl_data._M_start._4_4_;
              p_Var33[1]._M_left = (_Base_ptr)&(p_Var33[1]._M_left)->_M_left;
              local_e8.first = uVar5;
              local_e8.second.
              super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>._M_impl.
              super__Vector_impl_data._M_start = pwVar9;
            }
          }
        }
      }
      pvVar10 = pvVar10 + 1;
      p_Var12 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (pvVar10 != pvVar7);
    for (; (_Rb_tree_header *)p_Var12 != &local_a8._M_impl.super__Rb_tree_header;
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
      p_Var16 = p_Var12[1]._M_parent;
      p_Var33 = p_Var12[1]._M_left;
      if (p_Var16 != p_Var33) {
        pvVar22 = (local_b8->feature_to_example_map).
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + *(long *)(p_Var12 + 1);
        puVar20 = (pvVar22->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar24 = *(pointer *)
                   ((long)&(pvVar22->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data + 8);
        puVar26 = puVar20;
        puVar34 = puVar24;
        do {
          puVar35 = puVar26;
          if (puVar34 != puVar26) {
            pvVar25 = (local_b8->feature_to_example_map).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + *(long *)p_Var16;
            puVar28 = (pvVar25->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar35 = puVar34;
            if (*(pointer *)
                 ((long)&(pvVar25->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         )._M_impl.super__Vector_impl_data + 8) != puVar28) {
              uVar18 = 0;
              uVar31 = 0;
              do {
                if (puVar26[uVar18] == puVar28[uVar31]) {
                  *(int *)&p_Var16->_M_parent = *(int *)&p_Var16->_M_parent + 1;
                  uVar18 = uVar18 + 1;
                  uVar31 = uVar31 + 1;
                  puVar20 = (pvVar22->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start;
                  puVar24 = *(pointer *)
                             ((long)&(pvVar22->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data + 8);
                }
                else if (puVar28[uVar31] < puVar26[uVar18]) {
                  uVar31 = uVar31 + 1;
                }
                else {
                  uVar18 = uVar18 + 1;
                }
                puVar26 = puVar20;
                puVar35 = puVar24;
              } while ((uVar18 < (ulong)((long)puVar24 - (long)puVar20 >> 3)) &&
                      (puVar28 = (pvVar25->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_start,
                      uVar31 < (ulong)((long)*(pointer *)
                                              ((long)&(pvVar25->
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  )._M_impl.super__Vector_impl_data + 8) -
                                       (long)puVar28 >> 3)));
            }
          }
          p_Var16 = (_Base_ptr)&p_Var16->_M_left;
          puVar34 = puVar35;
        } while (p_Var16 != p_Var33);
      }
    }
  }
  if (local_b8->topics == 0) {
    uVar39 = 0;
  }
  else {
    fVar38 = 0.0;
    uVar18 = 0;
    plVar36 = local_b8;
    do {
      pfVar21 = local_58.
                super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar18].
                super__Vector_base<feature_pair,_std::allocator<feature_pair>_>._M_impl.
                super__Vector_impl_data._M_start;
      pfVar3 = local_58.
               super__Vector_base<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar18].
               super__Vector_base<feature_pair,_std::allocator<feature_pair>_>._M_impl.
               super__Vector_impl_data._M_finish;
      fVar40 = 0.0;
      if (pfVar21 != pfVar3) {
        fVar40 = 0.0;
        do {
          local_e8.first = pfVar21->f1;
          if ((plVar36->feature_counts).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[local_e8.first] != 0) {
            local_70.super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)pfVar21->f2;
            pmVar13 = std::
                      map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                      ::operator[]((map<unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
                                    *)&local_a8,&local_e8.first);
            _Var11 = std::
                     __find_if<__gnu_cxx::__normal_iterator<word_doc_frequency*,std::vector<word_doc_frequency,std::allocator<word_doc_frequency>>>,__gnu_cxx::__ops::_Iter_pred<compute_coherence_metrics<dense_parameters>(lda&,dense_parameters&)::_lambda(word_doc_frequency_const&)_2_>>
                               ((pmVar13->
                                super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                )._M_impl.super__Vector_impl_data._M_start,
                                (pmVar13->
                                super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>
                                )._M_impl.super__Vector_impl_data._M_finish,&local_70);
            plVar36 = local_b8;
            if (_Var11._M_current !=
                (pmVar13->
                super__Vector_base<word_doc_frequency,_std::allocator<word_doc_frequency>_>)._M_impl
                .super__Vector_impl_data._M_finish) {
              fVar37 = logf(((float)(_Var11._M_current)->count + 1e-06) /
                            (float)(local_b8->feature_counts).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[local_e8.first]);
              fVar40 = fVar40 + fVar37;
            }
          }
          pfVar21 = pfVar21 + 1;
        } while (pfVar21 != pfVar3);
      }
      printf("Topic %3d coherence: %f\n",SUB84((double)fVar40,0),uVar18 & 0xffffffff);
      fVar38 = fVar38 + fVar40;
      uVar18 = uVar18 + 1;
    } while (uVar18 < plVar36->topics);
    uVar39 = SUB84((double)(fVar38 / (float)plVar36->topics),0);
  }
  printf("Avg topic coherence: %f\n",uVar39);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<word_doc_frequency,_std::allocator<word_doc_frequency>_>_>_>_>
  ::~_Rb_tree(&local_a8);
  std::
  vector<std::vector<feature_pair,_std::allocator<feature_pair>_>,_std::allocator<std::vector<feature_pair,_std::allocator<feature_pair>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void compute_coherence_metrics(lda &l, T &weights)
{
  uint64_t length = (uint64_t)1 << l.all->num_bits;

  std::vector<std::vector<feature_pair>> topics_word_pairs;
  topics_word_pairs.resize(l.topics);

  int top_words_count = 10;  // parameterize and check

  for (size_t topic = 0; topic < l.topics; topic++)
  {
    // get top features for this topic
    auto cmp = [](feature &left, feature &right) { return left.x > right.x; };
    std::priority_queue<feature, std::vector<feature>, decltype(cmp)> top_features(cmp);
    typename T::iterator iter = weights.begin();
    for (uint64_t i = 0; i < min(top_words_count, length); i++, ++iter)
      top_features.push(feature((&(*iter))[topic], iter.index()));

    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if ((&(*v))[topic] > top_features.top().x)
      {
        top_features.pop();
        top_features.push(feature((&(*v))[topic], v.index()));
      }

    // extract idx and sort descending
    vector<uint64_t> top_features_idx;
    top_features_idx.resize(top_features.size());
    for (int i = (int)top_features.size() - 1; i >= 0; i--)
    {
      top_features_idx[i] = top_features.top().weight_index;
      top_features.pop();
    }

    auto &word_pairs = topics_word_pairs[topic];
    for (size_t i = 0; i < top_features_idx.size(); i++)
      for (size_t j = i + 1; j < top_features_idx.size(); j++)
        word_pairs.push_back(feature_pair(top_features_idx[i], top_features_idx[j]));
  }

  // compress word pairs and create record for storing frequency
  std::map<uint64_t, std::vector<word_doc_frequency>> coWordsDFSet;
  for (auto &vec : topics_word_pairs)
  {
    for (auto &wp : vec)
    {
      auto f1 = wp.f1;
      auto f2 = wp.f2;
      auto wdf = coWordsDFSet.find(f1);

      if (wdf != coWordsDFSet.end())
      {
        // http://stackoverflow.com/questions/5377434/does-stdmapiterator-return-a-copy-of-value-or-a-value-itself
        // if (wdf->second.find(f2) == wdf->second.end())

        if (std::find_if(wdf->second.begin(), wdf->second.end(),
                [&f2](const word_doc_frequency &v) { return v.idx == f2; }) != wdf->second.end())
        {
          wdf->second.push_back({f2, 0});
          // printf(" add %d %d\n", f1, f2);
        }
      }
      else
      {
        std::vector<word_doc_frequency> vec = {{f2, 0}};
        coWordsDFSet.insert(std::make_pair(f1, vec));
        // printf(" insert %d %d\n", f1, f2);
      }
    }
  }

  // this.GetWordPairsDocumentFrequency(coWordsDFSet);
  for (auto &pair : coWordsDFSet)
  {
    auto &examples_for_f1 = l.feature_to_example_map[pair.first];
    for (auto &wdf : pair.second)
    {
      auto &examples_for_f2 = l.feature_to_example_map[wdf.idx];

      // assumes examples_for_f1 and examples_for_f2 are orderd
      size_t i = 0;
      size_t j = 0;
      while (i < examples_for_f1.size() && j < examples_for_f2.size())
      {
        if (examples_for_f1[i] == examples_for_f2[j])
        {
          wdf.count++;
          i++;
          j++;
        }
        else if (examples_for_f2[j] < examples_for_f1[i])
          j++;
        else
          i++;
      }
    }
  }

  float epsilon = 1e-6f;  // TODO
  float avg_coherence = 0;
  for (size_t topic = 0; topic < l.topics; topic++)
  {
    float coherence = 0;

    for (auto &pairs : topics_word_pairs[topic])
    {
      auto f1 = pairs.f1;
      if (l.feature_counts[f1] == 0)
        continue;

      auto f2 = pairs.f2;
      auto &co_feature = coWordsDFSet[f1];
      auto co_feature_df = std::find_if(
          co_feature.begin(), co_feature.end(), [&f2](const word_doc_frequency &v) { return v.idx == f2; });

      if (co_feature_df != co_feature.end())
      {
        // printf("(%d:%d + eps)/(%d:%d)\n", f2, co_feature_df->count, f1, l.feature_counts[f1]);
        coherence += logf((co_feature_df->count + epsilon) / l.feature_counts[f1]);
      }
    }

    printf("Topic %3d coherence: %f\n", (int)topic, coherence);

    // TODO: expose per topic coherence

    // TODO: good vs. bad topics
    avg_coherence += coherence;
  }

  avg_coherence /= l.topics;

  printf("Avg topic coherence: %f\n", avg_coherence);
}